

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O3

int ProcessPacketUBX(uchar *packet,int packetlen,int mclass,int mid,UBXDATA *pUBXData)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [13];
  undefined7 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [13];
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar *__src;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined2 uVar33;
  undefined1 auVar35 [16];
  undefined1 uVar29;
  ushort uVar30;
  undefined1 uVar31;
  undefined7 uVar32;
  undefined3 uVar34;
  
  if (mclass != 1) {
    if (mclass != 5) {
      return 0;
    }
    if (mid != 0) {
      return 0;
    }
    printf("UBX packet not acknowledged : mclass = %02x, mid = %02x. \n",5,0);
    return 1;
  }
  __src = packet + 6;
  if (mid < 0x12) {
    switch(mid) {
    case 2:
      uVar8 = *(undefined8 *)__src;
      uVar12 = *(undefined8 *)(packet + 0xe);
      uVar13 = *(undefined8 *)(packet + 0x12);
      uVar14 = *(undefined8 *)(packet + 0x1a);
      (pUBXData->nav_posllh_pl).iTOW = (int)uVar8;
      (pUBXData->nav_posllh_pl).lon = (int)((ulong)uVar8 >> 0x20);
      (pUBXData->nav_posllh_pl).lat = (int)uVar12;
      (pUBXData->nav_posllh_pl).height = (int)((ulong)uVar12 >> 0x20);
      (pUBXData->nav_posllh_pl).height = (int)uVar13;
      (pUBXData->nav_posllh_pl).hMSL = (int)((ulong)uVar13 >> 0x20);
      (pUBXData->nav_posllh_pl).hAcc = (int)uVar14;
      (pUBXData->nav_posllh_pl).vAcc = (int)((ulong)uVar14 >> 0x20);
      uVar1 = (pUBXData->nav_posllh_pl).lon;
      uVar4 = (pUBXData->nav_posllh_pl).lat;
      pUBXData->Latitude = (double)(int)uVar4 * 1e-07;
      pUBXData->Longitude = (double)(int)uVar1 * 1e-07;
      pUBXData->Altitude = (double)((pUBXData->nav_posllh_pl).height * 1000);
      break;
    case 3:
      uVar8 = *(undefined8 *)__src;
      uVar12 = *(undefined8 *)(packet + 0xe);
      (pUBXData->nav_status_pl).iTOW = (int)uVar8;
      (pUBXData->nav_status_pl).gpsFix = (char)((ulong)uVar8 >> 0x20);
      (pUBXData->nav_status_pl).flags = (flags_NAV_STATUS_PL_UBX)(char)((ulong)uVar8 >> 0x28);
      (pUBXData->nav_status_pl).fixStat = (fixStat_NAV_STATUS_PL_UBX)(char)((ulong)uVar8 >> 0x30);
      (pUBXData->nav_status_pl).flags2 = (flags2_NAV_STATUS_PL_UBX)(char)((ulong)uVar8 >> 0x38);
      (pUBXData->nav_status_pl).ttff = (int)uVar12;
      (pUBXData->nav_status_pl).msss = (int)((ulong)uVar12 >> 0x20);
      break;
    case 6:
      *(undefined4 *)(pUBXData->nav_sol_pl).reserved2 = *(undefined4 *)(packet + 0x36);
      uVar8 = *(undefined8 *)__src;
      uVar12 = *(undefined8 *)(packet + 0xe);
      uVar13 = *(undefined8 *)(packet + 0x16);
      uVar14 = *(undefined8 *)(packet + 0x1e);
      uVar15 = *(undefined8 *)(packet + 0x26);
      uVar16 = *(undefined8 *)(packet + 0x2e);
      (pUBXData->nav_sol_pl).ecefVY = (int)uVar15;
      (pUBXData->nav_sol_pl).ecefVZ = (int)((ulong)uVar15 >> 0x20);
      (pUBXData->nav_sol_pl).sAcc = (int)uVar16;
      (pUBXData->nav_sol_pl).pDOP = (short)((ulong)uVar16 >> 0x20);
      (pUBXData->nav_sol_pl).reserved1 = (char)((ulong)uVar16 >> 0x30);
      (pUBXData->nav_sol_pl).numSV = (char)((ulong)uVar16 >> 0x38);
      (pUBXData->nav_sol_pl).ecefY = (int)uVar13;
      (pUBXData->nav_sol_pl).ecefZ = (int)((ulong)uVar13 >> 0x20);
      (pUBXData->nav_sol_pl).pAcc = (int)uVar14;
      (pUBXData->nav_sol_pl).ecefVX = (int)((ulong)uVar14 >> 0x20);
      (pUBXData->nav_sol_pl).iTOW = (int)uVar8;
      (pUBXData->nav_sol_pl).fTOW = (int)((ulong)uVar8 >> 0x20);
      (pUBXData->nav_sol_pl).week = (short)uVar12;
      (pUBXData->nav_sol_pl).gpsFix = (char)((ulong)uVar12 >> 0x10);
      (pUBXData->nav_sol_pl).flags = (flags_NAV_SOL_PL_UBX)(char)((ulong)uVar12 >> 0x18);
      (pUBXData->nav_sol_pl).ecefX = (int)((ulong)uVar12 >> 0x20);
      break;
    case 7:
      memcpy(&pUBXData->nav_pvt_pl,__src,0x5c);
      uVar3 = (pUBXData->nav_pvt_pl).lon;
      uVar6 = (pUBXData->nav_pvt_pl).lat;
      pUBXData->Latitude = (double)(int)uVar6 * 1e-07;
      pUBXData->Longitude = (double)(int)uVar3 * 1e-07;
      pUBXData->Altitude = (double)((pUBXData->nav_pvt_pl).height * 1000);
      pUBXData->year = (uint)(pUBXData->nav_pvt_pl).year;
      uVar7._0_1_ = (pUBXData->nav_pvt_pl).month;
      uVar7._1_1_ = (pUBXData->nav_pvt_pl).day;
      uVar7._2_1_ = (pUBXData->nav_pvt_pl).hour;
      uVar7._3_1_ = (pUBXData->nav_pvt_pl).minute;
      auVar9[0xc] = uVar7._3_1_;
      auVar9._0_12_ = ZEXT712(0);
      auVar18[1] = 0;
      auVar18[0] = uVar7._2_1_;
      auVar18._2_3_ = auVar9._10_3_;
      auVar18._5_8_ = 0;
      uVar31 = 0;
      uVar29 = uVar7._1_1_;
      uVar30 = CONCAT11(uVar31,uVar29);
      uVar10 = SUB137(auVar18 << 0x40,6);
      uVar32 = uVar10;
      auVar27._4_9_ = CONCAT72(uVar32,uVar30);
      auVar27._0_4_ = uVar7 & 0xff;
      auVar27._13_3_ = 0;
      pUBXData->month = auVar27._0_4_;
      pUBXData->day = (int)auVar27._4_9_;
      pUBXData->hour = (int)((uint7)uVar10 >> 0x10);
      pUBXData->minute = auVar27._12_4_;
      pUBXData->second =
           (double)(pUBXData->nav_pvt_pl).nano * 1e-09 + (double)(pUBXData->nav_pvt_pl).sec;
      auVar28._0_8_ = (double)(pUBXData->nav_pvt_pl).gSpeed;
      auVar28._8_8_ = (double)(pUBXData->nav_pvt_pl).headMot * 1e-05 * 3.141592653589793;
      auVar35 = divpd(auVar28,_DAT_001dcd50);
      goto LAB_001540ac;
    }
  }
  else {
    if (0x3a < mid) {
      if (mid == 0x3b) {
        uVar8 = *(undefined8 *)(packet + 0x26);
        (pUBXData->nav_svin_pl).obs = (int)uVar8;
        (pUBXData->nav_svin_pl).valid = (char)((ulong)uVar8 >> 0x20);
        (pUBXData->nav_svin_pl).active = (char)((ulong)uVar8 >> 0x28);
        (pUBXData->nav_svin_pl).reserved3[0] = (char)((ulong)uVar8 >> 0x30);
        (pUBXData->nav_svin_pl).reserved3[1] = (char)((ulong)uVar8 >> 0x38);
        uVar8 = *(undefined8 *)__src;
        uVar12 = *(undefined8 *)(packet + 0xe);
        uVar13 = *(undefined8 *)(packet + 0x16);
        uVar14 = *(undefined8 *)(packet + 0x1e);
        (pUBXData->nav_svin_pl).meanY = (int)uVar13;
        (pUBXData->nav_svin_pl).meanZ = (int)((ulong)uVar13 >> 0x20);
        (pUBXData->nav_svin_pl).meanXHP = (char)uVar14;
        (pUBXData->nav_svin_pl).meanYHP = (char)((ulong)uVar14 >> 8);
        (pUBXData->nav_svin_pl).meanZHP = (char)((ulong)uVar14 >> 0x10);
        (pUBXData->nav_svin_pl).reserved2 = (char)((ulong)uVar14 >> 0x18);
        (pUBXData->nav_svin_pl).meanAcc = (int)((ulong)uVar14 >> 0x20);
        (pUBXData->nav_svin_pl).version = (char)uVar8;
        (pUBXData->nav_svin_pl).reserved1[0] = (char)((ulong)uVar8 >> 8);
        (pUBXData->nav_svin_pl).reserved1[1] = (char)((ulong)uVar8 >> 0x10);
        (pUBXData->nav_svin_pl).reserved1[2] = (char)((ulong)uVar8 >> 0x18);
        (pUBXData->nav_svin_pl).iTOW = (int)((ulong)uVar8 >> 0x20);
        (pUBXData->nav_svin_pl).dur = (int)uVar12;
        (pUBXData->nav_svin_pl).meanX = (int)((ulong)uVar12 >> 0x20);
        return 0;
      }
      if (mid != 0x3c) {
        return 0;
      }
      uVar8 = *(undefined8 *)__src;
      uVar12 = *(undefined8 *)(packet + 0xe);
      uVar13 = *(undefined8 *)(packet + 0x16);
      uVar14 = *(undefined8 *)(packet + 0x1e);
      uVar15 = *(undefined8 *)(packet + 0x26);
      uVar16 = *(undefined8 *)(packet + 0x2e);
      uVar17 = *(undefined8 *)(packet + 0x36);
      uVar19 = packet[0x3e];
      uVar20 = packet[0x3f];
      uVar21 = packet[0x40];
      uVar22 = packet[0x41];
      uVar23 = packet[0x42];
      uVar24 = packet[0x43];
      uVar25 = packet[0x44];
      uVar26 = packet[0x45];
      (pUBXData->nav_relposned_pl).relPosD = (int)uVar13;
      (pUBXData->nav_relposned_pl).relPosLength = (int)((ulong)uVar13 >> 0x20);
      (pUBXData->nav_relposned_pl).relPosHeading = (int)uVar14;
      (pUBXData->nav_relposned_pl).reserved1[0] = (char)((ulong)uVar14 >> 0x20);
      (pUBXData->nav_relposned_pl).reserved1[1] = (char)((ulong)uVar14 >> 0x28);
      (pUBXData->nav_relposned_pl).reserved1[2] = (char)((ulong)uVar14 >> 0x30);
      (pUBXData->nav_relposned_pl).reserved1[3] = (char)((ulong)uVar14 >> 0x38);
      (pUBXData->nav_relposned_pl).accLength = (int)uVar17;
      (pUBXData->nav_relposned_pl).accHeading = (int)((ulong)uVar17 >> 0x20);
      (pUBXData->nav_relposned_pl).reserved2[0] = uVar19;
      (pUBXData->nav_relposned_pl).reserved2[1] = uVar20;
      (pUBXData->nav_relposned_pl).reserved2[2] = uVar21;
      (pUBXData->nav_relposned_pl).reserved2[3] = uVar22;
      (pUBXData->nav_relposned_pl).flags.field_0x0 = uVar23;
      (pUBXData->nav_relposned_pl).flags.field_0x1 = uVar24;
      (pUBXData->nav_relposned_pl).flags.field_0x2 = uVar25;
      (pUBXData->nav_relposned_pl).flags.field_0x3 = uVar26;
      (pUBXData->nav_relposned_pl).relPosHPN = (char)uVar15;
      (pUBXData->nav_relposned_pl).relPosHPE = (char)((ulong)uVar15 >> 8);
      (pUBXData->nav_relposned_pl).relPosHPD = (char)((ulong)uVar15 >> 0x10);
      (pUBXData->nav_relposned_pl).relPosHPPLength = (char)((ulong)uVar15 >> 0x18);
      (pUBXData->nav_relposned_pl).accN = (int)((ulong)uVar15 >> 0x20);
      (pUBXData->nav_relposned_pl).accE = (int)uVar16;
      (pUBXData->nav_relposned_pl).accD = (int)((ulong)uVar16 >> 0x20);
      (pUBXData->nav_relposned_pl).version = (char)uVar8;
      (pUBXData->nav_relposned_pl).reserved0 = (char)((ulong)uVar8 >> 8);
      (pUBXData->nav_relposned_pl).refStationId = (short)((ulong)uVar8 >> 0x10);
      (pUBXData->nav_relposned_pl).iTOW = (int)((ulong)uVar8 >> 0x20);
      (pUBXData->nav_relposned_pl).relPosN = (int)uVar12;
      (pUBXData->nav_relposned_pl).relPosE = (int)((ulong)uVar12 >> 0x20);
      pUBXData->Heading =
           ((double)(pUBXData->nav_relposned_pl).relPosHeading * 1e-05 * 3.141592653589793) / 180.0;
      return 0;
    }
    if (mid != 0x12) {
      if (mid != 0x14) {
        return 0;
      }
      uVar8 = *(undefined8 *)__src;
      uVar12 = *(undefined8 *)(packet + 0xe);
      uVar13 = *(undefined8 *)(packet + 0x16);
      uVar14 = *(undefined8 *)(packet + 0x1e);
      (pUBXData->nav_hposllh_pl).version = (char)uVar8;
      (pUBXData->nav_hposllh_pl).reserved0[0] = (char)((ulong)uVar8 >> 8);
      (pUBXData->nav_hposllh_pl).reserved0[1] = (char)((ulong)uVar8 >> 0x10);
      (pUBXData->nav_hposllh_pl).flags = (flags_NAV_HPOSLLH_PL_UBX)(char)((ulong)uVar8 >> 0x18);
      (pUBXData->nav_hposllh_pl).iTOW = (int)((ulong)uVar8 >> 0x20);
      (pUBXData->nav_hposllh_pl).lon = (int)uVar12;
      (pUBXData->nav_hposllh_pl).lat = (int)((ulong)uVar12 >> 0x20);
      (pUBXData->nav_hposllh_pl).height = (int)uVar13;
      (pUBXData->nav_hposllh_pl).hMSL = (int)((ulong)uVar13 >> 0x20);
      (pUBXData->nav_hposllh_pl).lonHp = (char)uVar14;
      (pUBXData->nav_hposllh_pl).latHp = (char)((ulong)uVar14 >> 8);
      (pUBXData->nav_hposllh_pl).heightHp = (char)((ulong)uVar14 >> 0x10);
      (pUBXData->nav_hposllh_pl).hMSLHp = (char)((ulong)uVar14 >> 0x18);
      (pUBXData->nav_hposllh_pl).hAcc = (int)((ulong)uVar14 >> 0x20);
      (pUBXData->nav_hposllh_pl).vAcc = *(uint *)(packet + 0x26);
      uVar2 = (pUBXData->nav_hposllh_pl).lon;
      uVar5 = (pUBXData->nav_hposllh_pl).lat;
      uVar33._0_1_ = (pUBXData->nav_hposllh_pl).lonHp;
      uVar33._1_1_ = (pUBXData->nav_hposllh_pl).latHp;
      uVar34 = CONCAT12(uVar33._1_1_,uVar33);
      uVar11 = CONCAT13(uVar33._1_1_,uVar34);
      uVar33 = CONCAT11((undefined1)uVar33,(undefined1)uVar33);
      auVar35 = ZEXT416(CONCAT22((short)((uint)uVar11 >> 0x10),uVar33));
      auVar35 = pshuflw(auVar35,auVar35,0x60);
      pUBXData->Latitude = ((double)(auVar35._4_4_ >> 0x18) * 0.01 + (double)(int)uVar5) * 1e-07;
      pUBXData->Longitude = ((double)(auVar35._0_4_ >> 0x18) * 0.01 + (double)(int)uVar2) * 1e-07;
      pUBXData->Altitude =
           ((double)(int)(pUBXData->nav_hposllh_pl).heightHp * 0.1 +
           (double)(pUBXData->nav_hposllh_pl).height) * 1000.0;
      return 0;
    }
    uVar8 = *(undefined8 *)__src;
    uVar12 = *(undefined8 *)(packet + 0xe);
    uVar13 = *(undefined8 *)(packet + 0x16);
    uVar14 = *(undefined8 *)(packet + 0x1e);
    (pUBXData->nav_velned_pl).speed = (int)uVar13;
    (pUBXData->nav_velned_pl).gSpeed = (int)((ulong)uVar13 >> 0x20);
    (pUBXData->nav_velned_pl).heading = (int)uVar14;
    (pUBXData->nav_velned_pl).sAcc = (int)((ulong)uVar14 >> 0x20);
    (pUBXData->nav_velned_pl).cAcc = *(uint *)(packet + 0x26);
    (pUBXData->nav_velned_pl).iTOW = (int)uVar8;
    (pUBXData->nav_velned_pl).velN = (int)((ulong)uVar8 >> 0x20);
    (pUBXData->nav_velned_pl).velE = (int)uVar12;
    (pUBXData->nav_velned_pl).velD = (int)((ulong)uVar12 >> 0x20);
    auVar35._0_8_ = (double)(pUBXData->nav_velned_pl).gSpeed;
    auVar35._8_8_ = (double)(pUBXData->nav_velned_pl).heading * 1e-05 * 3.141592653589793;
    auVar35 = divpd(auVar35,_DAT_001dcd30);
LAB_001540ac:
    pUBXData->SOG = (double)auVar35._0_8_;
    pUBXData->COG = (double)auVar35._8_8_;
  }
  return 0;
}

Assistant:

inline int ProcessPacketUBX(unsigned char* packet, int packetlen, int mclass, int mid, UBXDATA* pUBXData)
{
	unsigned char* payload = packet+MIN_PACKET_LENGTH_UBX-NB_BYTES_CHECKSUM_UBX;
	int payloadlen = packetlen-MIN_PACKET_LENGTH_UBX;

	UNREFERENCED_PARAMETER(payloadlen);

	//memset(pUBXData, 0, sizeof(UBXDATA));

	switch (mclass)
	{
	case ACK_CLASS_UBX:
		switch (mid)
		{
		case ACK_ACK_ID_UBX:
			break;
		case ACK_NAK_ID_UBX:
			printf("UBX packet not acknowledged : mclass = %02x, mid = %02x. \n", (int)(unsigned char)mclass, (int)(unsigned char)mid);
			return EXIT_FAILURE;
		default:
			// Unhandled...
			break;
		}
		break;
	case NAV_CLASS_UBX:
		switch (mid)
		{
		case NAV_HPOSLLH_ID_UBX:
			memcpy(&pUBXData->nav_hposllh_pl, payload, LEN_NAV_HPOSLLH_PL_UBX);
			//memcpy(&pUBXData->nav_hposllh_pl, payload, sizeof(pUBXData->nav_hposllh_pl));
			pUBXData->Latitude = (pUBXData->nav_hposllh_pl.lat+pUBXData->nav_hposllh_pl.latHp*0.01)*0.0000001; // In decimal degrees.
			pUBXData->Longitude = (pUBXData->nav_hposllh_pl.lon+pUBXData->nav_hposllh_pl.lonHp*0.01)*0.0000001; // In decimal degrees.
			pUBXData->Altitude = (pUBXData->nav_hposllh_pl.height+pUBXData->nav_hposllh_pl.heightHp*0.1)*1000; // In m.
			break;
		case NAV_POSLLH_ID_UBX:
			memcpy(&pUBXData->nav_posllh_pl, payload, LEN_NAV_POSLLH_PL_UBX);
			//memcpy(&pUBXData->nav_posllh_pl, payload, sizeof(pUBXData->nav_posllh_pl));
			pUBXData->Latitude = pUBXData->nav_posllh_pl.lat*0.0000001; // In decimal degrees.
			pUBXData->Longitude = pUBXData->nav_posllh_pl.lon*0.0000001; // In decimal degrees.
			pUBXData->Altitude = pUBXData->nav_posllh_pl.height*1000; // In m.
			break;
		case NAV_PVT_ID_UBX:
			memcpy(&pUBXData->nav_pvt_pl, payload, LEN_NAV_PVT_PL_UBX);
			//memcpy(&pUBXData->nav_pvt_pl, payload, sizeof(pUBXData->nav_pvt_pl));
			pUBXData->Latitude = pUBXData->nav_pvt_pl.lat*0.0000001; // In decimal degrees.
			pUBXData->Longitude = pUBXData->nav_pvt_pl.lon*0.0000001; // In decimal degrees.
			pUBXData->Altitude = pUBXData->nav_pvt_pl.height*1000; // In m.
			pUBXData->year = pUBXData->nav_pvt_pl.year;
			pUBXData->month = pUBXData->nav_pvt_pl.month;
			pUBXData->day = pUBXData->nav_pvt_pl.day;
			pUBXData->hour = pUBXData->nav_pvt_pl.hour;
			pUBXData->minute = pUBXData->nav_pvt_pl.minute; 
			pUBXData->second = pUBXData->nav_pvt_pl.sec+0.000000001*pUBXData->nav_pvt_pl.nano;	
			pUBXData->SOG = pUBXData->nav_pvt_pl.gSpeed/1000.0; // In m/s.
			pUBXData->COG = pUBXData->nav_pvt_pl.headMot*0.00001*M_PI/180.0; // In rad.
			break;
		case NAV_RELPOSNED_ID_UBX:
			memcpy(&pUBXData->nav_relposned_pl, payload, LEN_NAV_RELPOSNED_PL_UBX);
			//memcpy(&pUBXData->nav_relposned_pl, payload, sizeof(pUBXData->nav_relposned_pl));
			pUBXData->Heading = pUBXData->nav_relposned_pl.relPosHeading*0.00001*M_PI/180.0; // In rad
			break;
		case NAV_SOL_ID_UBX:
			memcpy(&pUBXData->nav_sol_pl, payload, LEN_NAV_SOL_PL_UBX);
			//memcpy(&pUBXData->nav_sol_pl, payload, sizeof(pUBXData->nav_sol_pl));
			break;
		case NAV_STATUS_ID_UBX:
			memcpy(&pUBXData->nav_status_pl, payload, LEN_NAV_STATUS_PL_UBX);
			//memcpy(&pUBXData->nav_status_pl, payload, sizeof(pUBXData->nav_status_pl));
			break;
		case NAV_SVIN_ID_UBX:
			memcpy(&pUBXData->nav_svin_pl, payload, LEN_NAV_SVIN_PL_UBX);
			//memcpy(&pUBXData->nav_svin_pl, payload, sizeof(pUBXData->nav_svin_pl));
			break;
		case NAV_VELNED_ID_UBX:
			memcpy(&pUBXData->nav_velned_pl, payload, LEN_NAV_VELNED_PL_UBX);
			//memcpy(&pUBXData->nav_velned_pl, payload, sizeof(pUBXData->nav_velned_pl));
			pUBXData->SOG = pUBXData->nav_velned_pl.gSpeed/100.0; // In m/s.
			pUBXData->COG = pUBXData->nav_velned_pl.heading*0.00001*M_PI/180.0; // In rad.
			break;
		default:
			// Unhandled...
			break;
		}
		break;
	default:
		// Unhandled...
		break;
	}

	return EXIT_SUCCESS;
}